

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * sqlite3DbStrDup(sqlite3 *db,char *z)

{
  int iVar1;
  void *__dest;
  char *pcVar2;
  
  if (z != (char *)0x0) {
    iVar1 = sqlite3Strlen30(z);
    __dest = sqlite3DbMallocRaw(db,iVar1 + 1U);
    if (__dest != (void *)0x0) {
      pcVar2 = (char *)memcpy(__dest,z,(ulong)(iVar1 + 1U));
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

SQLITE_PRIVATE char *sqlite3DbStrDup(sqlite3 *db, const char *z){
  char *zNew;
  size_t n;
  if( z==0 ){
    return 0;
  }
  n = sqlite3Strlen30(z) + 1;
  assert( (n&0x7fffffff)==n );
  zNew = sqlite3DbMallocRaw(db, (int)n);
  if( zNew ){
    memcpy(zNew, z, n);
  }
  return zNew;
}